

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O0

DnsHashEntry * __thiscall DnsHashEntry::CreateCopy(DnsHashEntry *this)

{
  DnsHashEntry *this_00;
  DnsHashEntry *key;
  DnsHashEntry *this_local;
  
  this_00 = (DnsHashEntry *)operator_new(0x60);
  DnsHashEntry(this_00);
  if (this_00 != (DnsHashEntry *)0x0) {
    this_00->registry_id = this->registry_id;
    this_00->key_type = this->key_type;
    this_00->key_length = this->key_length;
    memcpy(&this_00->field_6,&this->field_6,(ulong)this->key_length);
    this_00->count = this->count;
  }
  return this_00;
}

Assistant:

DnsHashEntry * DnsHashEntry::CreateCopy()
{
    DnsHashEntry * key = new DnsHashEntry();

    if (key != NULL)
    {
        key->registry_id = registry_id;
        key->key_type = key_type;
        key->key_length = key_length;
        memcpy(key->key_value, key_value, key_length);
        key->count = count;
    }

    return key;
}